

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormalsUtil.h
# Opt level: O3

void MapFormalsWithoutRest<ByteCodeGenerator::EmitOneFunction(ParseNodeFnc*)::__2>
               (ParseNodeFnc *pnodeFunc,anon_class_16_2_85211fcd fn)

{
  RegSlot rhsLocation;
  Symbol *sym;
  ParseNodeVar *pPVar1;
  
  if (pnodeFunc != (ParseNodeFnc *)0x0) {
    do {
      pPVar1 = ParseNode::AsParseNodeVar(&pnodeFunc->super_ParseNode);
      rhsLocation = pPVar1->sym->location;
      pPVar1 = ParseNode::AsParseNodeVar(&pnodeFunc->super_ParseNode);
      sym = pPVar1->sym;
      pPVar1 = ParseNode::AsParseNodeVar(&pnodeFunc->super_ParseNode);
      ByteCodeGenerator::EmitPropStore
                (fn.this,rhsLocation,sym,pPVar1->pid,*fn.funcInfo,false,false,false,false);
      pnodeFunc = (ParseNodeFnc *)ParseNode::GetFormalNext(&pnodeFunc->super_ParseNode);
    } while (pnodeFunc != (ParseNodeFnc *)0x0);
  }
  return;
}

Assistant:

void MapFormalsWithoutRest(ParseNodeFnc *pnodeFunc, Fn fn)
{
    return MapFormalsImpl<Fn, false>(pnodeFunc, fn);
}